

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool perfetto::metatrace::Enable(function<void_()> *read_task,TaskRunner *task_runner,uint32_t tags)

{
  uint32_t uVar1;
  Delegate *pDVar2;
  
  uVar1 = g_enabled_tags;
  if (g_enabled_tags == 0) {
    pDVar2 = anon_unknown_2::Delegate::GetInstance();
    pDVar2->task_runner = task_runner;
    std::function<void_()>::operator=(&pDVar2->read_task,read_task);
    RingBuffer::bankruptcy_record_._0_8_ = 0;
    RingBuffer::bankruptcy_record_._8_8_ = 0;
    memset(RingBuffer::records_,0,0x10000);
    LOCK();
    RingBuffer::wr_index_ = 0;
    UNLOCK();
    LOCK();
    RingBuffer::rd_index_ = 0;
    UNLOCK();
    LOCK();
    RingBuffer::has_overruns_ = 0;
    UNLOCK();
    LOCK();
    RingBuffer::read_task_queued_ = 0;
    UNLOCK();
    g_enabled_timestamp = base::GetBootTimeNs();
    g_enabled_tags = tags;
  }
  return uVar1 == 0;
}

Assistant:

OptionalStorage(OptionalStorage&& other) noexcept(
      std::is_nothrow_move_constructible<T>::value) {
    if (other.is_populated_)
      Init(std::move(other.value_));
  }